

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterYs<int> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterYRef *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  iVar16 = *(int *)((long)pGVar6->Ys +
                   (long)(((prim + pGVar6->Offset) % iVar16 + iVar16) % iVar16) *
                   (long)pGVar6->Stride);
  dVar18 = log10((pGVar6->XScale * (double)prim + pGVar6->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = (pIVar8->XAxis).Range.Min;
  iVar3 = pTVar7->YAxis;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  IVar2 = pIVar14->PixelRange[iVar3].Min;
  fVar21 = (float)(pIVar14->My[iVar3] * ((double)iVar16 - pIVar8->YAxis[iVar3].Range.Min) +
                  (double)IVar2.y);
  fVar22 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar18 / pIVar14->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar9->YRef;
  dVar19 = log10(((double)prim * pGVar9->XScale + pGVar9->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar18 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar17 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar19 / pIVar15->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar18) + dVar18) - dVar18) + (double)IVar2.x);
  fVar20 = (float)(pIVar15->My[iVar16] * (dVar1 - pIVar8->YAxis[iVar16].Range.Min) + (double)IVar2.y
                  );
  auVar26._0_4_ = ~-(uint)(fVar17 <= fVar22) & (uint)fVar17;
  auVar26._4_4_ = ~-(uint)(fVar20 <= fVar21) & (uint)fVar20;
  auVar26._8_4_ = ~-(uint)(fVar22 < fVar17) & (uint)fVar17;
  auVar26._12_4_ = ~-(uint)(fVar21 < fVar20) & (uint)fVar20;
  auVar12._4_4_ = (uint)fVar21 & -(uint)(fVar20 <= fVar21);
  auVar12._0_4_ = (uint)fVar22 & -(uint)(fVar17 <= fVar22);
  auVar12._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar17);
  auVar12._12_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar20);
  auVar26 = auVar26 | auVar12;
  fVar23 = (cull_rect->Min).y;
  auVar28._4_4_ = -(uint)(fVar23 < auVar26._4_4_);
  auVar28._0_4_ = -(uint)((cull_rect->Min).x < auVar26._0_4_);
  auVar13._4_8_ = auVar26._8_8_;
  auVar13._0_4_ = -(uint)(auVar26._4_4_ < fVar23);
  auVar27._0_8_ = auVar13._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(auVar26._8_4_ < (cull_rect->Max).x);
  auVar27._12_4_ = -(uint)(auVar26._12_4_ < (cull_rect->Max).y);
  auVar28._8_8_ = auVar27._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar28);
  if (iVar16 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar23 = fVar17 - fVar22;
    fVar24 = fVar20 - fVar21;
    fVar25 = fVar23 * fVar23 + fVar24 * fVar24;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar23 = fVar23 * fVar25;
      fVar24 = fVar24 * fVar25;
    }
    fVar25 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar23 = fVar25 * fVar23;
    fVar25 = fVar25 * fVar24;
    (pIVar10->pos).x = fVar25 + fVar22;
    (pIVar10->pos).y = fVar21 - fVar23;
    (pIVar10->uv).x = IVar2.x;
    (pIVar10->uv).y = IVar2.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar4;
    pIVar10[1].pos.x = fVar25 + fVar17;
    pIVar10[1].pos.y = fVar20 - fVar23;
    pIVar10[1].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar4;
    pIVar10[2].pos.x = fVar17 - fVar25;
    pIVar10[2].pos.y = fVar20 + fVar23;
    pIVar10[2].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar4;
    pIVar10[3].pos.x = fVar22 - fVar25;
    pIVar10[3].pos.y = fVar23 + fVar21;
    pIVar10[3].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar5;
    puVar11[1] = uVar5 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar5;
    puVar11[4] = uVar5 + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }